

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MathLibrary.cpp
# Opt level: O3

Var Js::Math::Max(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  undefined4 *puVar5;
  Var pvVar6;
  ulong uVar7;
  Var pvVar8;
  char *pcVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  CallInfo CVar14;
  int in_stack_00000010;
  CallInfo local_60;
  CallInfo callInfo_local;
  undefined1 local_48 [8];
  ArgumentReader args;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_60 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,699,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00d313b4;
    *puVar5 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  local_48 = (undefined1  [8])callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)local_48,&local_60);
  if (((ulong)local_48 & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,700,"(args.Info.Count > 0)","Should always have implicit \'this\'")
    ;
    if (!bVar3) goto LAB_00d313b4;
    *puVar5 = 0;
  }
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_60 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/MathLibrary.cpp"
                                ,0x2c0,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00d313b4;
    *puVar5 = 0;
  }
  uVar12 = local_48._0_4_;
  if ((uVar12 & 0xffffff) < 2) {
    return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
           negativeInfinite.ptr;
  }
  if ((uVar12 & 0xffffff) == 2) {
    pvVar6 = Arguments::operator[]((Arguments *)local_48,1);
    if (((ulong)pvVar6 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
        if ((ulong)pvVar6 >> 0x32 == 0) {
          CVar14 = (CallInfo)JavascriptConversion::ToNumber_Full(pvVar6,pSVar1);
        }
        else {
          CVar14 = (CallInfo)((ulong)pvVar6 ^ 0xfffc000000000000);
        }
        goto LAB_00d30dcf;
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar3) goto LAB_00d313b4;
      *puVar5 = 0;
    }
    CVar14 = (CallInfo)(double)(int)pvVar6;
    goto LAB_00d30dcf;
  }
  if (((ulong)local_48 & 0xfffffe) != 0) {
    uVar13 = 1;
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    do {
      pvVar6 = Arguments::operator[]((Arguments *)local_48,uVar13);
      if (((ulong)pvVar6 & 0x1ffff00000000) == 0x1000000000000 ||
          ((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
        if (((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
          pvVar6 = Arguments::operator[]((Arguments *)local_48,1);
          if (((ulong)pvVar6 & 0x1ffff00000000) == 0x1000000000000 ||
              ((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
            if (((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) goto LAB_00d311cd;
            if ((ulong)pvVar6 >> 0x32 == 0) {
              args.super_Arguments.Values = (Type)JavascriptConversion::ToNumber_Full(pvVar6,pSVar1)
              ;
            }
            else {
              args.super_Arguments.Values = (Type)((ulong)pvVar6 ^ 0xfffc000000000000);
            }
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar5 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                        "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
            if (!bVar3) goto LAB_00d313b4;
            *puVar5 = 0;
LAB_00d311cd:
            args.super_Arguments.Values = (Type)(double)(int)pvVar6;
          }
          bVar3 = NumberUtilities::IsNan((double)args.super_Arguments.Values);
          CVar14 = (CallInfo)args.super_Arguments.Values;
          if (2 < (local_48._0_4_ & 0xffffff)) {
            uVar12 = 2;
            goto LAB_00d31201;
          }
          if (bVar3) goto LAB_00d31354;
          goto LAB_00d30dcf;
        }
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar3) goto LAB_00d313b4;
        *puVar5 = 0;
      }
      uVar13 = uVar13 + 1;
      uVar12 = local_48._0_4_;
    } while (uVar13 < (uVar12 & 0xffffff));
  }
  pvVar6 = Arguments::operator[]((Arguments *)local_48,1);
  uVar7 = (ulong)pvVar6 & 0xffff000000000000;
  bVar3 = ((ulong)pvVar6 & 0x1ffff00000000) == 0x1000000000000;
  uVar13 = (uint)pvVar6;
  if ((uVar12 & 0xffffff) != 3) {
    if (bVar3 || uVar7 != 0x1000000000000) {
      if (uVar7 == 0x1000000000000) goto LAB_00d3101a;
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      pcVar10 = "(Is(aValue))";
      pcVar9 = "Ensure var is actually a \'TaggedInt\'";
      uVar11 = 0x43;
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
      pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
      uVar11 = 0x2a;
    }
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,uVar11,pcVar10,pcVar9);
    if (bVar3) {
      *puVar5 = 0;
LAB_00d3101a:
      if (2 < (local_48._0_4_ & 0xffffff)) {
        uVar12 = 2;
        puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        do {
          pvVar8 = Arguments::operator[]((Arguments *)local_48,uVar12);
          if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000 ||
              ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
            if (((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar5 = 1;
              uVar11 = 0x43;
              pcVar10 = "(Is(aValue))";
              pcVar9 = "Ensure var is actually a \'TaggedInt\'";
              goto LAB_00d310f4;
            }
          }
          else {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            *puVar5 = 1;
            uVar11 = 0x2a;
            pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
            pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
LAB_00d310f4:
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                        ,uVar11,pcVar10,pcVar9);
            if (!bVar3) goto LAB_00d313b4;
            *puVar5 = 0;
          }
          if ((int)pvVar8 < (int)pvVar6) {
            pvVar8 = pvVar6;
          }
          uVar13 = (uint)pvVar8;
          uVar12 = uVar12 + 1;
          pvVar6 = (Var)((ulong)pvVar8 & 0xffffffff);
        } while (uVar12 < (local_48._0_4_ & 0xffffff));
      }
      return (Var)((ulong)uVar13 | 0x1000000000000);
    }
    goto LAB_00d313b4;
  }
  if (bVar3 || uVar7 != 0x1000000000000) {
    if (uVar7 != 0x1000000000000) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      pcVar10 = "(Is(aValue))";
      pcVar9 = "Ensure var is actually a \'TaggedInt\'";
      uVar11 = 0x43;
      goto LAB_00d30f29;
    }
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar11 = 0x2a;
LAB_00d30f29:
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                ,uVar11,pcVar10,pcVar9);
    if (!bVar3) goto LAB_00d313b4;
    *puVar5 = 0;
  }
  pvVar8 = Arguments::operator[]((Arguments *)local_48,2);
  if (((ulong)pvVar8 & 0x1ffff00000000) == 0x1000000000000 ||
      ((ulong)pvVar8 & 0xffff000000000000) != 0x1000000000000) {
    if (((ulong)pvVar8 & 0xffff000000000000) == 0x1000000000000) goto LAB_00d3118d;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    pcVar10 = "(Is(aValue))";
    pcVar9 = "Ensure var is actually a \'TaggedInt\'";
    uVar11 = 0x43;
  }
  else {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    pcVar10 = "((uintptr_t)aValue >> 32 == (AtomTag << 16))";
    pcVar9 = "(uintptr_t)aValue >> 32 == (AtomTag << 16)";
    uVar11 = 0x2a;
  }
  bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                              ,uVar11,pcVar10,pcVar9);
  if (!bVar3) {
LAB_00d313b4:
    pcVar2 = (code *)invalidInstructionException();
    (*pcVar2)();
  }
  *puVar5 = 0;
LAB_00d3118d:
  if ((int)pvVar8 < (int)uVar13) {
    pvVar8 = pvVar6;
  }
  return (Var)((ulong)pvVar8 & 0xffffffff | 0x1000000000000);
  while( true ) {
    bVar4 = NumberUtilities::IsNan((double)callInfo_local);
    CVar14 = (CallInfo)args.super_Arguments.Values;
    if (bVar4) {
      bVar3 = true;
    }
    else if (bVar3 == false) {
      if (((((double)callInfo_local == 0.0) && (!NAN((double)callInfo_local))) &&
          (bVar4 = NumberUtilities::IsSpecial
                             ((double)args.super_Arguments.Values,0x8000000000000000), bVar4)) ||
         (CVar14 = (CallInfo)args.super_Arguments.Values,
         (double)args.super_Arguments.Values < (double)callInfo_local)) {
        CVar14 = callInfo_local;
      }
    }
    else {
      bVar3 = true;
    }
    uVar12 = uVar12 + 1;
    if ((local_48._0_4_ & 0xffffff) <= uVar12) break;
LAB_00d31201:
    args.super_Arguments.Values = (Type)CVar14;
    pvVar6 = Arguments::operator[]((Arguments *)local_48,uVar12);
    if (((ulong)pvVar6 & 0x1ffff00000000) == 0x1000000000000 ||
        ((ulong)pvVar6 & 0xffff000000000000) != 0x1000000000000) {
      if (((ulong)pvVar6 & 0xffff000000000000) == 0x1000000000000) goto LAB_00d31296;
      if (pvVar6 < (Var)0x4000000000000) {
        callInfo_local = (CallInfo)JavascriptConversion::ToNumber_Full(pvVar6,pSVar1);
      }
      else {
        callInfo_local = (CallInfo)((ulong)pvVar6 ^ 0xfffc000000000000);
      }
    }
    else {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      *puVar5 = 1;
      bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                  ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                  "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
      if (!bVar4) goto LAB_00d313b4;
      *puVar5 = 0;
LAB_00d31296:
      callInfo_local = (CallInfo)(double)(int)pvVar6;
    }
  }
  if (bVar3 != false) {
LAB_00d31354:
    return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).nan.
           ptr;
  }
LAB_00d30dcf:
  pvVar6 = JavascriptNumber::ToVarNoCheck((double)CVar14,pSVar1);
  return pvVar6;
}

Assistant:

Var Math::Max(RecyclableObject* function, CallInfo callInfo, ...)
    {
        PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

        ARGUMENTS(args, callInfo);
        AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");
        ScriptContext* scriptContext = function->GetScriptContext();
        bool hasOnlyIntegerArgs = false;

        Assert(!(callInfo.Flags & CallFlags_New));

        if (args.Info.Count <= 1)
        {
            return scriptContext->GetLibrary()->GetNegativeInfinite();
        }
        else if (args.Info.Count == 2)
        {
            double result = JavascriptConversion::ToNumber(args[1], scriptContext);
            return JavascriptNumber::ToVarNoCheck(result, scriptContext);
        }
        else
        {
            hasOnlyIntegerArgs = TaggedInt::OnlyContainsTaggedInt(args);
            if (hasOnlyIntegerArgs && args.Info.Count == 3)
            {
                return TaggedInt::ToVarUnchecked(max(TaggedInt::ToInt32(args[1]), TaggedInt::ToInt32(args[2])));
            }
        }

        if (hasOnlyIntegerArgs)
        {
            int32 current = TaggedInt::ToInt32(args[1]);
            for (uint idxArg = 2; idxArg < args.Info.Count; idxArg++)
            {
                int32 compare = TaggedInt::ToInt32(args[idxArg]);
                if (current < compare)
                {
                    current = compare;
                }
            }

            return TaggedInt::ToVarUnchecked(current);
        }
        else
        {
            double current = JavascriptConversion::ToNumber(args[1], scriptContext);

            bool returnNaN = false;
            if (JavascriptNumber::IsNan(current))
            {
                returnNaN = true;
            }

            for (uint idxArg = 2; idxArg < args.Info.Count; idxArg++)
            {
                double compare = JavascriptConversion::ToNumber(args[idxArg], scriptContext);
                if (JavascriptNumber::IsNan(compare) || returnNaN) // Call ToNumber for all args
                {
                    returnNaN = true;
                }

                // In C++, -0.0f == 0.0f; however, in ES, -0.0f < 0.0f. Thus, use additional library 
                // call to test this comparison.
                else if ((compare == 0 && JavascriptNumber::IsNegZero(current)) ||
                    current < compare)
                {
                    current = compare;
                }
            }

            if (returnNaN)
            {
                return scriptContext->GetLibrary()->GetNaN();
            }

            return JavascriptNumber::ToVarNoCheck(current, scriptContext);
        }
    }